

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

void FindStates(lemon *lemp)

{
  config *pcVar1;
  config *newcfp;
  rule *prStack_20;
  int i;
  rule *rp;
  symbol *sp;
  lemon *lemp_local;
  
  Configlist_init();
  if (lemp->start == (char *)0x0) {
    rp = (rule *)lemp->startRule->lhs;
  }
  else {
    rp = (rule *)Symbol_find(lemp->start);
    if (rp == (rule *)0x0) {
      ErrorMsg(lemp->filename,0,
               "The specified start symbol \"%s\" is not in a nonterminal of the grammar.  \"%s\" will be used as the start symbol instead."
               ,lemp->start,lemp->startRule->lhs->name);
      lemp->errorcnt = lemp->errorcnt + 1;
      rp = (rule *)lemp->startRule->lhs;
    }
  }
  for (prStack_20 = lemp->rule; prStack_20 != (rule *)0x0; prStack_20 = prStack_20->next) {
    for (newcfp._4_4_ = 0; newcfp._4_4_ < prStack_20->nrhs; newcfp._4_4_ = newcfp._4_4_ + 1) {
      if ((rule *)prStack_20->rhs[newcfp._4_4_] == rp) {
        ErrorMsg(lemp->filename,0,
                 "The start symbol \"%s\" occurs on the right-hand side of a rule. This will result in a parser which does not work properly."
                 ,rp->lhs);
        lemp->errorcnt = lemp->errorcnt + 1;
      }
    }
  }
  for (prStack_20 = *(rule **)&rp->lhsStart; prStack_20 != (rule *)0x0;
      prStack_20 = prStack_20->nextlhs) {
    prStack_20->lhsStart = 1;
    pcVar1 = Configlist_addbasis(prStack_20,0);
    SetAdd(pcVar1->fws,0);
  }
  getstate(lemp);
  return;
}

Assistant:

void FindStates(struct lemon *lemp)
{
  struct symbol *sp;
  struct rule *rp;

  Configlist_init();

  /* Find the start symbol */
  if( lemp->start ){
    sp = Symbol_find(lemp->start);
    if( sp==0 ){
      ErrorMsg(lemp->filename,0,
        "The specified start symbol \"%s\" is not "
        "in a nonterminal of the grammar.  \"%s\" will be used as the start "
        "symbol instead.",lemp->start,lemp->startRule->lhs->name);
      lemp->errorcnt++;
      sp = lemp->startRule->lhs;
    }
  }else{
    sp = lemp->startRule->lhs;
  }

  /* Make sure the start symbol doesn't occur on the right-hand side of
  ** any rule.  Report an error if it does.  (YACC would generate a new
  ** start symbol in this case.) */
  for(rp=lemp->rule; rp; rp=rp->next){
    int i;
    for(i=0; i<rp->nrhs; i++){
      if( rp->rhs[i]==sp ){   /* FIX ME:  Deal with multiterminals */
        ErrorMsg(lemp->filename,0,
          "The start symbol \"%s\" occurs on the "
          "right-hand side of a rule. This will result in a parser which "
          "does not work properly.",sp->name);
        lemp->errorcnt++;
      }
    }
  }

  /* The basis configuration set for the first state
  ** is all rules which have the start symbol as their
  ** left-hand side */
  for(rp=sp->rule; rp; rp=rp->nextlhs){
    struct config *newcfp;
    rp->lhsStart = 1;
    newcfp = Configlist_addbasis(rp,0);
    SetAdd(newcfp->fws,0);
  }

  /* Compute the first state.  All other states will be
  ** computed automatically during the computation of the first one.
  ** The returned pointer to the first state is not used. */
  (void)getstate(lemp);
  return;
}